

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

CallInfo * growCI(lua_State *L)

{
  CallInfo *pCVar1;
  lua_State *in_RDI;
  int in_stack_0000000c;
  lua_State *in_stack_00000010;
  
  if (in_RDI->size_ci < 0x4e21) {
    luaD_reallocCI(in_stack_00000010,in_stack_0000000c);
    if (20000 < in_RDI->size_ci) {
      luaG_runerror(in_RDI,"stack overflow");
    }
  }
  else {
    luaD_throw(L,(int)((ulong)in_RDI >> 0x20));
  }
  pCVar1 = in_RDI->ci;
  in_RDI->ci = pCVar1 + 1;
  return pCVar1 + 1;
}

Assistant:

static CallInfo*growCI(lua_State*L){
if(L->size_ci>20000)
luaD_throw(L,5);
else{
luaD_reallocCI(L,2*L->size_ci);
if(L->size_ci>20000)
luaG_runerror(L,"stack overflow");
}
return++L->ci;
}